

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  FILE *__stream;
  size_t sVar7;
  size_t sVar8;
  byte bVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sStack_8c0;
  FILE *local_8b8;
  char *local_8b0;
  addrinfo *ai;
  undefined8 *local_8a0;
  addrinfo hints;
  int local_868 [526];
  
  fileName = *argv;
  local_8b8 = _stdout;
  local_8b0 = (char *)malloc(0x400);
  pcVar10 = "80";
  bVar1 = false;
  bVar9 = 0;
  while( true ) {
    while( true ) {
      iVar3 = __posix_getopt(argc,argv,"p:o:d:");
      if (iVar3 != 0x70) break;
      if (bVar1) goto LAB_00101798;
      pcVar10 = strdup(_optarg);
      iVar3 = isValidPort(pcVar10);
      bVar1 = true;
      if (iVar3 == 0) {
        fprintf(_stderr,"%s ERROR: ",fileName);
        pcVar10 = "INVALID PORT";
        sStack_8c0 = 0xc;
        goto LAB_001017ea;
      }
    }
    if (iVar3 == -1) break;
    if (iVar3 == 100) {
      bVar2 = 4;
    }
    else {
      if (iVar3 != 0x6f) goto LAB_00101798;
      bVar2 = 2;
    }
    if (bVar9 != 0) goto LAB_00101798;
    local_8b0 = strdup(_optarg);
    bVar9 = bVar2;
  }
  pcVar11 = argv[_optind];
  if (pcVar11 != (char *)0x0) {
    puVar5 = (undefined8 *)malloc(0x10);
    iVar3 = strncmp(pcVar11,"http://",7);
    if (iVar3 != 0) {
      fwrite("invalid url",0xb,1,_stderr);
      goto LAB_001017fe;
    }
    pcVar11 = pcVar11 + 7;
    pcVar6 = strpbrk(pcVar11,";/?:@=&");
    if (pcVar6 == (char *)0x0) {
      pcVar11 = strdup(pcVar11);
      *puVar5 = pcVar11;
LAB_00101554:
      pcVar6 = "index.html";
    }
    else {
      pcVar11 = strndup(pcVar11,(long)pcVar6 - (long)pcVar11);
      *puVar5 = pcVar11;
      if (pcVar6[1] == '\0') goto LAB_00101554;
      pcVar6 = pcVar6 + 1;
    }
    pcVar6 = strdup(pcVar6);
    puVar5[1] = pcVar6;
    hints.ai_flags = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_next = (addrinfo *)0x0;
    hints.ai_family = 2;
    hints.ai_socktype = 1;
    iVar3 = getaddrinfo(pcVar11,pcVar10,(addrinfo *)&hints,(addrinfo **)&ai);
    if (iVar3 == 0) {
      iVar3 = socket(ai->ai_family,ai->ai_socktype,ai->ai_protocol);
      if (iVar3 < 0) {
        fprintf(_stderr,"%s ERROR: ",fileName);
        pcVar10 = "socket";
LAB_00101945:
        sStack_8c0 = 6;
      }
      else {
        iVar4 = connect(iVar3,(sockaddr *)ai->ai_addr,ai->ai_addrlen);
        if (iVar4 < 0) {
          fprintf(_stderr,"%s ERROR: ",fileName);
          pcVar10 = "connection";
          sStack_8c0 = 10;
        }
        else {
          __stream = fdopen(iVar3,"r+");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR: ",fileName);
            pcVar10 = "fdopen";
            goto LAB_00101945;
          }
          memset(local_868,0,0x82c);
          pcVar10 = (char *)puVar5[1];
          sprintf((char *)local_868,"GET /%s HTTP/1.1\r\nHost: %s\r\nConnection: close\r\n\r\n",
                  pcVar10,*puVar5);
          iVar3 = fputs((char *)local_868,__stream);
          if (iVar3 == -1) {
            fprintf(_stderr,"%s ERROR: ",fileName);
            pcVar10 = "fputs";
            sStack_8c0 = 5;
          }
          else {
            iVar3 = fflush(__stream);
            if (iVar3 == -1) {
              fprintf(_stderr,"%s ERROR: ",fileName);
              pcVar10 = "fflush";
              goto LAB_00101945;
            }
            pcVar11 = (char *)malloc(0x400);
            fgets(pcVar11,0x400,__stream);
            iVar3 = __isoc99_sscanf(pcVar11,"HTTP/1.1 %d",local_868);
            if (iVar3 != 1) {
              fprintf(_stderr,"%s\n",pcVar11);
              pcVar10 = "%s ERROR: invalid header\n";
              goto LAB_001017b3;
            }
            if (local_868[0] != 200) {
              fprintf(_stderr,"%s ERROR: %s\n",fileName,pcVar11 + 9);
              goto LAB_001017fe;
            }
            free(pcVar11);
            if (bVar9 == 0) {
LAB_00101744:
              goToEndOfHeader((FILE *)__stream);
              writeFileToFile((FILE *)__stream,(FILE *)local_8b8);
              fflush(local_8b8);
              fclose(local_8b8);
              free((void *)*puVar5);
              free((void *)puVar5[1]);
              fclose(__stream);
              return 0;
            }
            local_8a0 = puVar5;
            sVar7 = strlen(local_8b0);
            if ((bVar9 & 4) == 0) {
              pcVar11 = (char *)malloc(sVar7 + 1);
              strcpy(pcVar11,local_8b0);
            }
            else {
              sVar8 = strlen(pcVar10);
              pcVar11 = (char *)malloc(sVar7 + sVar8 + 2);
              strcpy(pcVar11,local_8b0);
              sVar7 = strlen(pcVar11);
              (pcVar11 + sVar7)[0] = '/';
              (pcVar11 + sVar7)[1] = '\0';
              strcat(pcVar11,pcVar10);
            }
            local_8b8 = fopen(pcVar11,"w");
            free(pcVar11);
            free(local_8b0);
            puVar5 = local_8a0;
            if (local_8b8 != (FILE *)0x0) goto LAB_00101744;
            fprintf(_stderr,"%s ERROR: ",fileName);
            pcVar10 = "Could not open File";
            sStack_8c0 = 0x13;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar10 = "getaddrinfo";
      sStack_8c0 = 0xb;
    }
LAB_001017ea:
    fwrite(pcVar10,sStack_8c0,1,_stderr);
    fputc(10,_stderr);
    goto LAB_001017fe;
  }
LAB_00101798:
  pcVar10 = "USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n";
LAB_001017b3:
  fprintf(_stderr,pcVar10,fileName);
LAB_001017fe:
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	FLAG_S flags = {0,0,0};
	FILE * out = stdout;
	char* p_port = "80";
	char *d_dir= malloc(sizeof(char)*CHARLENGTH);

	int c;
	while ((c= getopt(argc, argv, "p:o:d:")) != -1) {
		switch (c) {
		case 'p':
			if (flags.p_flag) { USAGE(); }
				 flags.p_flag++; 
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'o':
			if (flags.o_flag || flags.d_flag) { USAGE(); }
				flags.o_flag++; 
				d_dir = strdup(optarg);
				break;
		case 'd':
			if(flags.o_flag || flags.d_flag) { USAGE(); }
				flags.d_flag++; 
				d_dir = strdup(optarg);
				break;
		default:
			USAGE();
		}
	}
	
	
	char * fullUrl;
	if ((fullUrl=argv[optind]) == NULL) {
		USAGE();
	}
	URL_S *url = URL(fullUrl);


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // create Internet Protocol (IP) socket
	hints.ai_socktype = SOCK_STREAM; // use TCP as transport protocol

	if (getaddrinfo(url->url, p_port, &hints, &ai) != 0) {ERROR_EXIT("getaddrinfo");}

	int sockfd;
	if ((sockfd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol)) < 0) { ERROR_EXIT("socket"); }

	if ((connect(sockfd, ai->ai_addr, ai->ai_addrlen)) < 0)
		ERROR_EXIT("connection");

	FILE *sockfile = fdopen(sockfd, "r+");
	if (sockfile == NULL)
		ERROR_EXIT("fdopen");


	printHeader(sockfile,url);
	checkResponseHeader(sockfile);


	
	if (flags.o_flag || flags.d_flag) {
		char * pathOutFile;
		if (flags.d_flag) {
			pathOutFile = malloc((strlen(d_dir) + 2 + strlen(url->file)) * sizeof(char));
			strcpy(pathOutFile,d_dir);
			strcat(pathOutFile, "/");
			strcat(pathOutFile, url->file);
		} else{
			pathOutFile = malloc((strlen(d_dir) + 1) * sizeof(char));
			strcpy(pathOutFile,d_dir);
		}
		out = fopen(pathOutFile, "w");
		free(pathOutFile);
		free(d_dir);
		if (out == NULL) {ERROR_EXIT("Could not open File"); }
	}
	
	
	goToEndOfHeader(sockfile);
	writeFileToFile(sockfile,out);
	fflush(out);
	fclose(out);
	free_URL(url);
	fclose(sockfile);
	return 0;
}